

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_comp.cpp
# Opt level: O0

bool crnlib::create_texture_mipmaps
               (mipmapped_texture *work_tex,crn_comp_params *params,crn_mipmap_params *mipmap_params
               ,bool generate_mipmaps)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint width;
  uint height;
  uint uVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  double dVar12;
  bool local_47d;
  double t;
  timer tm;
  generate_mipmap_params gen_params;
  char *pFilter_1;
  undefined1 auStack_400 [7];
  bool srgb_1;
  resample_params res_params;
  bool srgb;
  char *pFilter;
  int uheight;
  int uwidth;
  int lheight;
  int lwidth;
  uint uStack_3c0;
  bool is_pow2;
  int new_height;
  int new_width;
  rect window_rect;
  bool generate_new_mips;
  crn_comp_params new_params;
  bool generate_mipmaps_local;
  crn_mipmap_params *mipmap_params_local;
  crn_comp_params *params_local;
  mipmapped_texture *work_tex_local;
  
  memcpy(window_rect.m_corner[1].m_s + 1,params,0x378);
  window_rect.m_corner[1].m_s[0]._3_1_ = 0;
  switch(mipmap_params->m_mode) {
  case cCRNMipModeUseSourceOrGenerateMips:
    uVar3 = mipmapped_texture::get_num_levels(work_tex);
    if (uVar3 == 1) {
      window_rect.m_corner[1].m_s[0]._3_1_ = 1;
    }
    break;
  case cCRNMipModeUseSourceMips:
    break;
  case cCRNMipModeGenerateMips:
    window_rect.m_corner[1].m_s[0]._3_1_ = 1;
    break;
  case cCRNMipModeNoMips:
    mipmapped_texture::discard_mipmaps(work_tex);
  }
  rect::rect((rect *)&new_height,mipmap_params->m_window_left,mipmap_params->m_window_top,
             mipmap_params->m_window_right,mipmap_params->m_window_bottom);
  bVar2 = rect::is_empty((rect *)&new_height);
  if (!bVar2) {
    uVar3 = mipmapped_texture::get_num_faces(work_tex);
    if (uVar3 < 2) {
      uVar4 = rect::get_left((rect *)&new_height);
      uVar5 = rect::get_top((rect *)&new_height);
      uVar6 = rect::get_right((rect *)&new_height);
      uVar7 = rect::get_bottom((rect *)&new_height);
      console::info("Cropping input texture from window (%ux%u)-(%ux%u)",(ulong)uVar4,(ulong)uVar5,
                    (ulong)uVar6,(ulong)uVar7);
      uVar3 = rect::get_left((rect *)&new_height);
      uVar8 = rect::get_top((rect *)&new_height);
      width = rect::get_width((rect *)&new_height);
      height = rect::get_height((rect *)&new_height);
      bVar2 = mipmapped_texture::crop(work_tex,uVar3,uVar8,width,height);
      if (!bVar2) {
        console::warning("Failed cropping window rect");
      }
    }
    else {
      console::warning("Can\'t crop cubemap textures");
    }
  }
  uStack_3c0 = mipmapped_texture::get_width(work_tex);
  lwidth = mipmapped_texture::get_height(work_tex);
  if ((((mipmap_params->m_clamp_width != 0) && (mipmap_params->m_clamp_height != 0)) &&
      (((int)mipmap_params->m_clamp_width < (int)uStack_3c0 ||
       ((int)mipmap_params->m_clamp_height < lwidth)))) && (mipmap_params->m_clamp_scale == 0)) {
    uVar3 = mipmapped_texture::get_num_faces(work_tex);
    if (uVar3 < 2) {
      uStack_3c0 = math::minimum<unsigned_int>(mipmap_params->m_clamp_width,uStack_3c0);
      lwidth = math::minimum<unsigned_int>(mipmap_params->m_clamp_height,lwidth);
      console::info("Clamping input texture to %ux%u",(ulong)uStack_3c0,(ulong)(uint)lwidth);
      mipmapped_texture::crop(work_tex,0,0,uStack_3c0,lwidth);
    }
    else {
      console::warning("Can\'t crop cubemap textures");
    }
  }
  if (mipmap_params->m_scale_mode != cCRNSMDisabled) {
    bVar2 = math::is_power_of_2(uStack_3c0);
    local_47d = false;
    if (bVar2) {
      local_47d = math::is_power_of_2(lwidth);
    }
    lheight._3_1_ = local_47d;
    switch(mipmap_params->m_scale_mode) {
    case cCRNSMAbsolute:
      uStack_3c0 = (uint)(long)mipmap_params->m_scale_x;
      lwidth = (int)(long)mipmap_params->m_scale_y;
      break;
    case cCRNSMRelative:
      uStack_3c0 = (uint)(long)(mipmap_params->m_scale_x * (float)(int)uStack_3c0 + 0.5);
      lwidth = (int)(long)(mipmap_params->m_scale_y * (float)lwidth + 0.5);
      break;
    case cCRNSMLowerPow2:
      if (local_47d == false) {
        math::compute_lower_pow2_dim((int *)&stack0xfffffffffffffc40,&lwidth);
      }
      break;
    case cCRNSMNearestPow2:
      if (local_47d == false) {
        uwidth = uStack_3c0;
        uheight = lwidth;
        math::compute_lower_pow2_dim(&uwidth,&uheight);
        pFilter._4_4_ = uStack_3c0;
        pFilter._0_4_ = lwidth;
        math::compute_upper_pow2_dim((int *)((long)&pFilter + 4),(int *)&pFilter);
        lVar9 = (long)(int)(uStack_3c0 - uwidth);
        if (lVar9 < 1) {
          lVar9 = -lVar9;
        }
        lVar11 = (long)(int)(uStack_3c0 - pFilter._4_4_);
        if (lVar11 < 1) {
          lVar11 = -lVar11;
        }
        if (lVar9 < lVar11) {
          uStack_3c0 = uwidth;
        }
        else {
          uStack_3c0 = pFilter._4_4_;
        }
        lVar9 = (long)(lwidth - uheight);
        if (lVar9 < 1) {
          lVar9 = -lVar9;
        }
        lVar11 = (long)(lwidth - (int)pFilter);
        if (lVar11 < 1) {
          lVar11 = -lVar11;
        }
        if (lVar9 < lVar11) {
          lwidth = uheight;
        }
        else {
          lwidth = (int)pFilter;
        }
      }
      break;
    case cCRNSMNextPow2:
      if (local_47d == false) {
        math::compute_upper_pow2_dim((int *)&stack0xfffffffffffffc40,&lwidth);
      }
    }
  }
  if (((mipmap_params->m_clamp_width != 0) && (mipmap_params->m_clamp_height != 0)) &&
     ((((int)mipmap_params->m_clamp_width < (int)uStack_3c0 ||
       ((int)mipmap_params->m_clamp_height < lwidth)) && (mipmap_params->m_clamp_scale != 0)))) {
    uStack_3c0 = math::minimum<unsigned_int>(mipmap_params->m_clamp_width,uStack_3c0);
    lwidth = math::minimum<unsigned_int>(mipmap_params->m_clamp_height,lwidth);
  }
  uStack_3c0 = math::clamp<int>(uStack_3c0,1,0x1000);
  lwidth = math::clamp<int>(lwidth,1,0x1000);
  uVar3 = uStack_3c0;
  uVar8 = mipmapped_texture::get_width(work_tex);
  iVar1 = lwidth;
  if (((uVar3 != uVar8) || (uVar3 = mipmapped_texture::get_height(work_tex), iVar1 != uVar3)) ||
     ((mipmap_params->m_renormalize == 1 && (mipmap_params->m_rtopmip == 1)))) {
    console::info("Resampling input texture to %ux%u",(ulong)uStack_3c0,(ulong)(uint)lwidth);
    pcVar10 = crn_get_mip_filter_name(mipmap_params->m_filter);
    res_params._23_1_ = mipmap_params->m_gamma_filtering != 0;
    mipmapped_texture::resample_params::resample_params((resample_params *)auStack_400);
    res_params.m_pFilter._0_1_ = mipmap_params->m_tiled != 0;
    _auStack_400 = pcVar10;
    uVar3 = mipmapped_texture::get_num_faces(work_tex);
    if (uVar3 != 0) {
      res_params.m_pFilter._0_1_ = 0;
    }
    res_params.m_pFilter._2_1_ = mipmap_params->m_renormalize != 0;
    res_params.m_pFilter._4_4_ = 0x3f800000;
    res_params._8_4_ = mipmap_params->m_gamma;
    res_params.m_pFilter._1_1_ = res_params._23_1_ & 1;
    res_params.m_filter_scale._0_1_ = params->m_num_helper_threads != 0;
    bVar2 = mipmapped_texture::resize(work_tex,uStack_3c0,lwidth,(resample_params *)auStack_400);
    if (!bVar2) {
      console::error("Failed resizing texture!");
      return false;
    }
  }
  if (((window_rect.m_corner[1].m_s[0]._3_1_ & 1) != 0) && (generate_mipmaps)) {
    pcVar10 = crn_get_mip_filter_name(mipmap_params->m_filter);
    mipmapped_texture::generate_mipmap_params::generate_mipmap_params
              ((generate_mipmap_params *)&tm.field_0x10);
    tm._16_8_ = pcVar10;
    console::info("Generating mipmaps using filter \"%s\"",pcVar10);
    timer::timer((timer *)&t);
    timer::start((timer *)&t);
    bVar2 = mipmapped_texture::generate_mipmaps
                      (work_tex,(generate_mipmap_params *)&tm.field_0x10,true);
    if (!bVar2) {
      console::error("Failed generating mipmaps!");
      return false;
    }
    dVar12 = timer::get_elapsed_secs((timer *)&t);
    uVar3 = mipmapped_texture::get_num_levels(work_tex);
    console::info("Generated %u mipmap levels in %3.3fs",dVar12,(ulong)(uVar3 - 1));
  }
  return true;
}

Assistant:

bool create_texture_mipmaps(mipmapped_texture& work_tex, const crn_comp_params& params, const crn_mipmap_params& mipmap_params, bool generate_mipmaps)
    {
        crn_comp_params new_params(params);

        bool generate_new_mips = false;

        switch (mipmap_params.m_mode)
        {
        case cCRNMipModeUseSourceOrGenerateMips:
        {
            if (work_tex.get_num_levels() == 1)
            {
                generate_new_mips = true;
            }
            break;
        }
        case cCRNMipModeUseSourceMips:
        {
            break;
        }
        case cCRNMipModeGenerateMips:
        {
            generate_new_mips = true;
            break;
        }
        case cCRNMipModeNoMips:
        {
            work_tex.discard_mipmaps();
            break;
        }
        default:
        {
            CRNLIB_ASSERT(0);
            break;
        }
        }

        rect window_rect(mipmap_params.m_window_left, mipmap_params.m_window_top, mipmap_params.m_window_right, mipmap_params.m_window_bottom);

        if (!window_rect.is_empty())
        {
            if (work_tex.get_num_faces() > 1)
            {
                console::warning("Can't crop cubemap textures");
            }
            else
            {
                console::info("Cropping input texture from window (%ux%u)-(%ux%u)", window_rect.get_left(), window_rect.get_top(), window_rect.get_right(), window_rect.get_bottom());

                if (!work_tex.crop(window_rect.get_left(), window_rect.get_top(), window_rect.get_width(), window_rect.get_height()))
                {
                    console::warning("Failed cropping window rect");
                }
            }
        }

        int new_width = work_tex.get_width();
        int new_height = work_tex.get_height();

        if ((mipmap_params.m_clamp_width) && (mipmap_params.m_clamp_height))
        {
            if ((new_width > (int)mipmap_params.m_clamp_width) || (new_height > (int)mipmap_params.m_clamp_height))
            {
                if (!mipmap_params.m_clamp_scale)
                {
                    if (work_tex.get_num_faces() > 1)
                    {
                        console::warning("Can't crop cubemap textures");
                    }
                    else
                    {
                        new_width = math::minimum<uint>(mipmap_params.m_clamp_width, new_width);
                        new_height = math::minimum<uint>(mipmap_params.m_clamp_height, new_height);
                        console::info("Clamping input texture to %ux%u", new_width, new_height);
                        work_tex.crop(0, 0, new_width, new_height);
                    }
                }
            }
        }

        if (mipmap_params.m_scale_mode != cCRNSMDisabled)
        {
            bool is_pow2 = math::is_power_of_2((uint32)new_width) && math::is_power_of_2((uint32)new_height);

            switch (mipmap_params.m_scale_mode)
            {
            case cCRNSMAbsolute:
            {
                new_width = (uint)mipmap_params.m_scale_x;
                new_height = (uint)mipmap_params.m_scale_y;
                break;
            }
            case cCRNSMRelative:
            {
                new_width = (uint)(mipmap_params.m_scale_x * new_width + .5f);
                new_height = (uint)(mipmap_params.m_scale_y * new_height + .5f);
                break;
            }
            case cCRNSMLowerPow2:
            {
                if (!is_pow2)
                {
                    math::compute_lower_pow2_dim(new_width, new_height);
                }
                break;
            }
            case cCRNSMNearestPow2:
            {
                if (!is_pow2)
                {
                    int lwidth = new_width;
                    int lheight = new_height;
                    math::compute_lower_pow2_dim(lwidth, lheight);

                    int uwidth = new_width;
                    int uheight = new_height;
                    math::compute_upper_pow2_dim(uwidth, uheight);

                    if (labs(new_width - lwidth) < labs(new_width - uwidth))
                    {
                        new_width = lwidth;
                    }
                    else
                    {
                        new_width = uwidth;
                    }

                    if (labs(new_height - lheight) < labs(new_height - uheight))
                    {
                        new_height = lheight;
                    }
                    else
                    {
                        new_height = uheight;
                    }
                }
                break;
            }
            case cCRNSMNextPow2:
            {
                if (!is_pow2)
                {
                    math::compute_upper_pow2_dim(new_width, new_height);
                }
                break;
            }
            default:
                break;
            }
        }

        if ((mipmap_params.m_clamp_width) && (mipmap_params.m_clamp_height))
        {
            if ((new_width > (int)mipmap_params.m_clamp_width) || (new_height > (int)mipmap_params.m_clamp_height))
            {
                if (mipmap_params.m_clamp_scale)
                {
                    new_width = math::minimum<uint>(mipmap_params.m_clamp_width, new_width);
                    new_height = math::minimum<uint>(mipmap_params.m_clamp_height, new_height);
                }
            }
        }

        new_width = math::clamp<int>(new_width, 1, cCRNMaxLevelResolution);
        new_height = math::clamp<int>(new_height, 1, cCRNMaxLevelResolution);

        if ((new_width != (int)work_tex.get_width()) || (new_height != (int)work_tex.get_height()) || (mipmap_params.m_renormalize == true && mipmap_params.m_rtopmip == true))
        {
            console::info("Resampling input texture to %ux%u", new_width, new_height);

            const char* pFilter = crn_get_mip_filter_name(mipmap_params.m_filter);

            bool srgb = mipmap_params.m_gamma_filtering != 0;

            mipmapped_texture::resample_params res_params;
            res_params.m_pFilter = pFilter;
            res_params.m_wrapping = mipmap_params.m_tiled != 0;
            if (work_tex.get_num_faces())
            {
                res_params.m_wrapping = false;
            }
            res_params.m_renormalize = mipmap_params.m_renormalize != 0;
            res_params.m_filter_scale = 1.0f;
            res_params.m_gamma = mipmap_params.m_gamma;
            res_params.m_srgb = srgb;
            res_params.m_multithreaded = (params.m_num_helper_threads > 0);

            if (!work_tex.resize(new_width, new_height, res_params))
            {
                console::error("Failed resizing texture!");
                return false;
            }
        }

        if ((generate_new_mips) && (generate_mipmaps))
        {
            bool srgb = mipmap_params.m_gamma_filtering != 0;

            const char* pFilter = crn_get_mip_filter_name(mipmap_params.m_filter);

            mipmapped_texture::generate_mipmap_params gen_params;
            gen_params.m_pFilter = pFilter;
            gen_params.m_wrapping = mipmap_params.m_tiled != 0;
            gen_params.m_renormalize = mipmap_params.m_renormalize != 0;
            gen_params.m_filter_scale = mipmap_params.m_blurriness;
            gen_params.m_gamma = mipmap_params.m_gamma;
            gen_params.m_srgb = srgb;
            gen_params.m_multithreaded = params.m_num_helper_threads > 0;
            gen_params.m_max_mips = mipmap_params.m_max_levels;
            gen_params.m_min_mip_size = mipmap_params.m_min_mip_size;

            console::info("Generating mipmaps using filter \"%s\"", pFilter);

            timer tm;
            tm.start();
            if (!work_tex.generate_mipmaps(gen_params, true))
            {
                console::error("Failed generating mipmaps!");
                return false;
            }
            double t = tm.get_elapsed_secs();

            console::info("Generated %u mipmap levels in %3.3fs", work_tex.get_num_levels() - 1, t);
        }

        return true;
    }